

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O0

ImageVolume * __thiscall
LayerConv::convolution_backward
          (ImageVolume *__return_storage_ptr__,LayerConv *this,ImageVolume *dZ,ImageVolume *next_z,
          LayerSize *output_size)

{
  int iVar1;
  size_t sVar2;
  size_type sVar3;
  ostream *poVar4;
  const_reference pvVar5;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  ulong uVar6;
  long lVar7;
  reference pvVar8;
  reference __x;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pMVar9;
  Matrix<double,_1,_1,0,_1,_1> *this_01;
  undefined1 auVar10 [16];
  CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> CVar11;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_148;
  _func_double_double *local_130;
  CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_128;
  undefined1 local_118 [8];
  MatrixXd prev_z_df;
  int local_f8;
  int c_1;
  int img_ind;
  RhsNested local_e8;
  undefined1 local_e0 [8];
  MatrixXd conv_mat;
  MatrixXd filters_mat;
  MatrixXd input_mat;
  int local_84;
  undefined1 local_80 [4];
  int f_ind;
  LayerValues filter;
  undefined1 local_60 [4];
  int c;
  ImageVolume filters_reshape;
  double padding;
  int f_num;
  size_type f_channels;
  LayerSize *output_size_local;
  ImageVolume *next_z_local;
  ImageVolume *dZ_local;
  LayerConv *this_local;
  ImageVolume *output;
  
  sVar3 = std::
          vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
          ::size(dZ);
  if (sVar3 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"convolution_backward");
    poVar4 = std::operator<<(poVar4,":: fatal error: ");
    poVar4 = std::operator<<(poVar4,"empty input is not allowed!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    pvVar5 = std::
             vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
             ::operator[](dZ,0);
    sVar3 = std::
            vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::size(pvVar5);
    iVar1 = output_size->channels;
    lVar7 = output_size->rows;
    sVar2 = this->__filter_size;
    pvVar5 = std::
             vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
             ::operator[](dZ,0);
    this_00 = &std::
               vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](pvVar5,0)->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
    uVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(this_00);
    lVar7 = ~uVar6 + lVar7 + sVar2;
    auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = 0x45300000;
    filters_reshape.
    super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)floor(((auVar10._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 2.0);
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
              *)local_60);
    for (filter.
         super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        (ulong)(long)filter.
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < sVar3;
        filter.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             filter.
             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)local_80);
      for (local_84 = 0; local_84 < iVar1; local_84 = local_84 + 1) {
        pvVar8 = std::
                 vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
                 ::operator[](&this->__filters,(long)local_84);
        __x = std::
              vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[](pvVar8,(long)filter.
                                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::push_back((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)local_80,__x);
      }
      std::
      vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
      ::push_back((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                   *)local_60,(value_type *)local_80);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)local_80);
    }
    img2mat((MatrixXd *)
            &filters_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols,this,dZ,output_size,this->__filter_size,
            (int)(double)filters_reshape.
                         super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    filters2mat((MatrixXd *)
                &conv_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_cols,this,(ImageVolume *)local_60,true);
    _img_ind = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                          &filters_mat.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols,
                          (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                          &conv_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_cols);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_e0,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&img_ind);
    mat2img(__return_storage_ptr__,this,(MatrixXd *)local_e0,output_size);
    local_f8 = 0;
    while( true ) {
      sVar3 = std::
              vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
              ::size(__return_storage_ptr__);
      if (sVar3 <= (ulong)(long)local_f8) break;
      for (prev_z_df.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols._4_4_ = 0;
          prev_z_df.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols._4_4_ < iVar1;
          prev_z_df.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols._4_4_ = prev_z_df.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols._4_4_ + 1) {
        pvVar5 = std::
                 vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
                 ::operator[](next_z,(long)local_f8);
        pMVar9 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                 std::
                 vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[](pvVar5,(long)prev_z_df.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_cols._4_4_);
        local_130 = util::df_relu;
        CVar11 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                 unaryExpr<double(*)(double)>(pMVar9,&local_130);
        local_128 = CVar11;
        Eigen::Matrix<double,-1,-1,0,-1,-1>::
        Matrix<Eigen::CwiseUnaryOp<double(*)(double),Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_118,
                   (EigenBase<Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_128);
        pvVar8 = std::
                 vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)local_f8);
        pMVar9 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                 std::
                 vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[](pvVar8,(long)prev_z_df.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_cols._4_4_);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        cwiseProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  (&local_148,pMVar9,
                   (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_118);
        pvVar8 = std::
                 vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)local_f8);
        this_01 = (Matrix<double,_1,_1,0,_1,_1> *)
                  std::
                  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                  ::operator[](pvVar8,(long)prev_z_df.
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                            .m_storage.m_cols._4_4_);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                  (this_01,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            *)&local_148);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_118);
      }
      local_f8 = local_f8 + 1;
    }
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_e0)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &conv_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &filters_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols);
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

ImageVolume LayerConv::convolution_backward(const ImageVolume& dZ, const ImageVolume& next_z, const LayerSize& output_size) {
	if (dZ.size() <= 0) {
		cout << __FUNCTION__ << ":: fatal error: " << "empty input is not allowed!" << endl;
		return ImageVolume();
	}
	auto f_channels = dZ[0].size(); // filter channels number
	auto f_num = output_size.channels; // filters number
	auto padding = floor((output_size.rows + __filter_size - dZ[0][0].rows() - 1) / 2.0);

	ImageVolume filters_reshape;
	for (auto c = 0; c < f_channels; c++) {
		LayerValues filter;
		for (auto f_ind = 0; f_ind < f_num; f_ind++)
			filter.push_back(__filters[f_ind][c]);
		filters_reshape.push_back(filter);
	}

	auto input_mat = img2mat(dZ, output_size, __filter_size, padding, 1);
	auto filters_mat = filters2mat(filters_reshape, true);
	MatrixXd conv_mat = input_mat * filters_mat;
	auto output = mat2img(conv_mat, output_size);

	// f_num is the new channels.
	for (auto img_ind = 0; img_ind < output.size(); img_ind++) {
		for (auto c = 0; c < f_num; c++) {
			MatrixXd prev_z_df = next_z[img_ind][c].unaryExpr(&util::df_relu);
			output[img_ind][c] = output[img_ind][c].cwiseProduct(prev_z_df);
		}
	}

	return output;
}